

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void check_type_68k(int type,LispPTR *ptr)

{
  ushort uVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  
  pDVar2 = MDStypetbl;
  LVar3 = LAddrFromNative(ptr);
  uVar1 = *(ushort *)((ulong)(pDVar2 + (LVar3 >> 9)) ^ 2);
  LVar3 = LAddrFromNative(ptr);
  pDVar2 = MDStypetbl;
  if ((uVar1 & 0x7ff) == type) {
    LVar4 = LAddrFromNative(ptr);
    printf("LispPTR 0x%x is the datatype %d\n",(ulong)LVar3,
           (ulong)(*(ushort *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2) & 0x7ff));
    return;
  }
  printf("Mismatching occur !!! LispAddr 0x%x  type %d\n",(ulong)LVar3,type);
  exit(-1);
}

Assistant:

void check_type_68k(int type, LispPTR *ptr) {
  if (type != (GetTypeNumber(LAddrFromNative(ptr)))) {
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n", LAddrFromNative(ptr), type);
    exit(-1);
  }

  printf("LispPTR 0x%x is the datatype %d\n", LAddrFromNative(ptr),
         GetTypeNumber(LAddrFromNative(ptr)));
}